

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_armor.cpp
# Opt level: O2

AInventory * __thiscall ABasicArmor::CreateCopy(ABasicArmor *this,AActor *other)

{
  int iVar1;
  FNameNoInit FVar2;
  ABasicArmor *pAVar3;
  ulong uVar4;
  
  pAVar3 = Spawn<ABasicArmor>();
  uVar4 = -(ulong)(this->SavePercent != 0.0);
  pAVar3->SavePercent = (double)(~uVar4 & 0x3fd5559b3d07c84b | (ulong)this->SavePercent & uVar4);
  iVar1 = (this->super_AArmor).super_AInventory.MaxAmount;
  (pAVar3->super_AArmor).super_AInventory.Amount = (this->super_AArmor).super_AInventory.Amount;
  (pAVar3->super_AArmor).super_AInventory.MaxAmount = iVar1;
  (pAVar3->super_AArmor).super_AInventory.Icon.texnum =
       (this->super_AArmor).super_AInventory.Icon.texnum;
  FVar2.super_FName.Index = (this->ArmorType).super_FName;
  pAVar3->BonusCount = this->BonusCount;
  pAVar3->ArmorType = (FNameNoInit)FVar2.super_FName.Index;
  pAVar3->ActualSaveAmount = this->ActualSaveAmount;
  (*(this->super_AArmor).super_AInventory.super_AActor.super_DThinker.super_DObject._vptr_DObject
    [0x36])(this);
  return (AInventory *)pAVar3;
}

Assistant:

AInventory *ABasicArmor::CreateCopy (AActor *other)
{
	// BasicArmor that is in use is stored in the inventory as BasicArmor.
	// BasicArmor that is in reserve is not.
	ABasicArmor *copy = Spawn<ABasicArmor> ();
	copy->SavePercent = SavePercent != 0 ? SavePercent : 0.33335;	// slightly more than 1/3 to avoid roundoff errors.
	copy->Amount = Amount;
	copy->MaxAmount = MaxAmount;
	copy->Icon = Icon;
	copy->BonusCount = BonusCount;
	copy->ArmorType = ArmorType;
	copy->ActualSaveAmount = ActualSaveAmount;
	GoAwayAndDie ();
	return copy;
}